

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  pointer pUVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  CfdException *pCVar6;
  AbstractTxIn *this_00;
  pointer utxo;
  ByteData256 sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_5a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_588;
  AbstractTxIn *local_580;
  AbstractTxIn *local_578;
  ByteData hash;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  undefined1 local_52c [12];
  UtxoData target_utxo;
  
  local_588 = utxo_list;
  UtxoData::UtxoData(&target_utxo);
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (&utxos,((long)(this->super_Transaction).vin_.
                           super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_Transaction).vin_.
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x90);
  local_580 = &((this->super_Transaction).vin_.
                super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  for (this_00 = &((this->super_Transaction).vin_.
                   super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_AbstractTxIn; this_00 != local_580;
      this_00 = this_00 + 1) {
    core::AbstractTxIn::GetTxid((Txid *)&sighash,this_00);
    uVar4 = core::AbstractTxIn::GetVout(this_00);
    core::OutPoint::OutPoint((OutPoint *)&hash,(Txid *)&sighash,uVar4);
    core::Txid::~Txid((Txid *)&sighash);
    pUVar1 = (local_588->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = false;
    local_578 = this_00;
    for (utxo = (local_588->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                _M_impl.super__Vector_impl_data._M_start; utxo != pUVar1; utxo = utxo + 1) {
      core::AbstractTxIn::GetTxid((Txid *)&sighash,this_00);
      bVar2 = core::Txid::Equals((Txid *)&sighash,&utxo->txid);
      if (bVar2) {
        uVar5 = core::AbstractTxIn::GetVout(this_00);
        uVar4 = utxo->vout;
        core::Txid::~Txid((Txid *)&sighash);
        this_00 = local_578;
        if (uVar5 == uVar4) {
          GetLockingScriptFromUtxoData((Script *)&sighash,utxo);
          std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
          emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                    ((vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>> *)&utxos,
                     &utxo->amount,(Script *)&sighash);
          bVar3 = core::OutPoint::operator==(outpoint,(OutPoint *)&hash);
          if (bVar3) {
            UtxoData::operator=(&target_utxo,utxo);
            core::Script::operator=(&target_utxo.locking_script,(Script *)&sighash);
          }
          core::Script::~Script((Script *)&sighash);
          bVar3 = true;
        }
      }
      else {
        core::Txid::~Txid((Txid *)&sighash);
      }
    }
    if (!bVar3) {
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&sighash,"Utxo is not found. VerifyInputSchnorrSignature fail.",
                 (allocator *)&local_5a0);
      core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&sighash);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Txid::~Txid((Txid *)&hash);
  }
  bVar3 = core::Amount::operator==(&target_utxo.amount,0);
  if (bVar3) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sighash,"OutPoint is not found into utxo_list.",(allocator *)&hash);
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&sighash);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar3 = core::Script::IsTaprootScript(&target_utxo.locking_script);
  if (bVar3) {
    core::Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &sighash,&target_utxo.locking_script);
    core::ScriptElement::GetBinaryData
              (&hash,(ScriptElement *)
                     (sighash.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x60));
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &sighash);
    core::SchnorrPubkey::GetData((ByteData *)&sighash,pubkey);
    bVar3 = core::ByteData::Equals(&hash,(ByteData *)&sighash);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
    if (bVar3) {
      uVar4 = (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0xf])
                        (this,outpoint);
      core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_52c);
      if (annex == (ByteData *)0x0) {
        core::ByteData::ByteData((ByteData *)&local_5a0);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a0,&annex->data_
                  );
      }
      core::Transaction::GetSchnorrSignatureHash
                (&sighash,&this->super_Transaction,uVar4,(SigHashType *)local_52c,&utxos,
                 (TapScriptData *)0x0,(ByteData *)&local_5a0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_5a0);
      bVar3 = core::SchnorrPubkey::Verify(pubkey,signature,&sighash);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&utxos);
      UtxoData::~UtxoData(&target_utxo);
      return bVar3;
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sighash,"Unmatch locking script.",(allocator *)&local_5a0);
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&sighash);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sighash,"Target OutPoint is not taproot.",(allocator *)&hash);
  core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&sighash);
  __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}